

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptFullySpecifiedType
          (HlslGrammar *this,TType *type,TIntermNode **nodeList,TAttributes *attributes,
          bool forbidDeclarators)

{
  HlslParseContext *this_00;
  bool bVar1;
  int iVar2;
  EHlslTokenClass EVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar4;
  TQualifier *pTVar5;
  undefined8 *puVar6;
  byte bVar7;
  TQualifier qualifier;
  TSourceLoc loc;
  
  bVar7 = 0;
  TQualifier::clear(&qualifier);
  bVar1 = acceptPreQualifier(this,&qualifier);
  if (bVar1) {
    loc.column = (this->super_HlslTokenStream).token.loc.column;
    loc._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    loc.name = (this->super_HlslTokenStream).token.loc.name;
    loc.string = (this->super_HlslTokenStream).token.loc.string;
    loc.line = (this->super_HlslTokenStream).token.loc.line;
    bVar1 = acceptType(this,type,nodeList);
    if (bVar1) {
      acceptPostQualifier(this,&qualifier);
      iVar2 = (*type->_vptr_TType[7])(type);
      if (iVar2 == 0x10) {
        this_00 = this->parseContext;
        iVar2 = (*type->_vptr_TType[10])(type);
        HlslParseContext::mergeQualifiers
                  (this_00,(TQualifier *)CONCAT44(extraout_var,iVar2),&qualifier);
        HlslParseContext::transferTypeAttributes
                  (this->parseContext,&(this->super_HlslTokenStream).token.loc,attributes,type,false
                  );
        if ((forbidDeclarators) ||
           (EVar3 = HlslTokenStream::peek(&this->super_HlslTokenStream), EVar3 != EHTokIdentifier))
        {
          HlslParseContext::declareBlock(this->parseContext,&loc,type,(TString *)0x0);
        }
      }
      else {
        if (qualifier._44_1_ != '\0') {
          __assert_fail("qualifier.layoutFormat == ElfNone",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslGrammar.cpp"
                        ,0x285,
                        "bool glslang::HlslGrammar::acceptFullySpecifiedType(TType &, TIntermNode *&, const TAttributes &, bool)"
                       );
        }
        iVar2 = (*type->_vptr_TType[10])(type);
        qualifier._44_1_ = *(undefined1 *)(CONCAT44(extraout_var_00,iVar2) + 0x2c);
        iVar2 = (*type->_vptr_TType[10])(type);
        qualifier._8_8_ =
             qualifier._8_8_ & 0xfffffffff1ffffff |
             (ulong)((uint)*(undefined8 *)(CONCAT44(extraout_var_01,iVar2) + 8) & 0xe000000);
        iVar2 = (*type->_vptr_TType[10])(type);
        if (((*(uint *)(CONCAT44(extraout_var_02,iVar2) + 8) & 0x7f) == 0x11) ||
           (iVar2 = (*type->_vptr_TType[10])(type),
           (*(uint *)(CONCAT44(extraout_var_03,iVar2) + 8) & 0x7f) == 6)) {
          iVar2 = (*type->_vptr_TType[10])(type);
          qualifier._8_8_ =
               qualifier._8_8_ & 0xffffffffffffff80 |
               (ulong)((uint)*(undefined8 *)(CONCAT44(extraout_var_04,iVar2) + 8) & 0x7f);
          iVar2 = (*type->_vptr_TType[10])(type);
          qualifier._8_8_ =
               qualifier._8_8_ & 0xffff7fffffffffff |
               *(ulong *)(CONCAT44(extraout_var_05,iVar2) + 8) & 0x800000000000;
        }
        iVar2 = (*type->_vptr_TType[0x29])(type);
        if ((char)iVar2 != '\0') {
          iVar2 = (*type->_vptr_TType[10])(type);
          qualifier._8_8_ =
               qualifier._8_8_ & 0xffffffffffff007f |
               (ulong)((uint)*(undefined8 *)(CONCAT44(extraout_var_06,iVar2) + 8) & 0xff80);
        }
        iVar2 = (*type->_vptr_TType[10])(type);
        pTVar5 = &qualifier;
        puVar6 = (undefined8 *)CONCAT44(extraout_var_07,iVar2);
        for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar6 = pTVar5->semanticName;
          pTVar5 = (TQualifier *)((long)pTVar5 + (ulong)bVar7 * -0x10 + 8);
          puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
        }
      }
    }
    else if ((qualifier._8_8_ & 0x200000000000) != 0) {
      HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptFullySpecifiedType(TType& type, TIntermNode*& nodeList, const TAttributes& attributes, bool forbidDeclarators)
{
    // type_qualifier
    TQualifier qualifier;
    qualifier.clear();
    if (! acceptPreQualifier(qualifier))
        return false;
    TSourceLoc loc = token.loc;

    // type_specifier
    if (! acceptType(type, nodeList)) {
        // If this is not a type, we may have inadvertently gone down a wrong path
        // by parsing "sample", which can be treated like either an identifier or a
        // qualifier.  Back it out, if we did.
        if (qualifier.sample)
            recedeToken();

        return false;
    }

    // type_qualifier
    if (! acceptPostQualifier(qualifier))
       return false;

    if (type.getBasicType() == EbtBlock) {
        // the type was a block, which set some parts of the qualifier
        parseContext.mergeQualifiers(type.getQualifier(), qualifier);
    
        // merge in the attributes
        parseContext.transferTypeAttributes(token.loc, attributes, type);

        // further, it can create an anonymous instance of the block
        // (cbuffer and tbuffer don't consume the next identifier, and
        // should set forbidDeclarators)
        if (forbidDeclarators || peek() != EHTokIdentifier)
            parseContext.declareBlock(loc, type);
    } else {
        // Some qualifiers are set when parsing the type.  Merge those with
        // whatever comes from acceptPreQualifier and acceptPostQualifier.
        assert(qualifier.layoutFormat == ElfNone);

        qualifier.layoutFormat = type.getQualifier().layoutFormat;
        qualifier.precision    = type.getQualifier().precision;

        if (type.getQualifier().storage == EvqOut ||
            type.getQualifier().storage == EvqBuffer) {
            qualifier.storage      = type.getQualifier().storage;
            qualifier.readonly     = type.getQualifier().readonly;
        }

        if (type.isBuiltIn())
            qualifier.builtIn = type.getQualifier().builtIn;

        type.getQualifier() = qualifier;
    }

    return true;
}